

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DoubleParameter::set_allocated_range
          (DoubleParameter *this,DoubleRange *range)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  DoubleRange *range_local;
  DoubleParameter *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_AllowedValues(this);
  if (range != (DoubleRange *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&range->super_MessageLite);
    message_arena = (Arena *)range;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<CoreML::Specification::DoubleRange>
                              (message_arena_00,range,submessage_arena_00);
    }
    set_has_range(this);
    (this->AllowedValues_).range_ = (DoubleRange *)message_arena;
  }
  return;
}

Assistant:

void DoubleParameter::set_allocated_range(::CoreML::Specification::DoubleRange* range) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_AllowedValues();
  if (range) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(range));
    if (message_arena != submessage_arena) {
      range = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, range, submessage_arena);
    }
    set_has_range();
    AllowedValues_.range_ = range;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.DoubleParameter.range)
}